

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bessel.c
# Opt level: O3

double xc_bessel_I1(double x)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = 0.0;
  if ((x != 0.0) || (NAN(x))) {
    dVar5 = ABS(x);
    if (dVar5 < 4.450147717014403e-308) {
      xc_bessel_I1_cold_1();
      dVar5 = 0.0;
    }
    else if (4.2146848510894035e-08 <= dVar5) {
      if (dVar5 <= 3.0) {
        dVar4 = (x * x) / 4.5 + -1.0;
        uVar1 = 0xc;
        dVar5 = 0.0;
        dVar2 = 0.0;
        do {
          dVar3 = dVar5;
          dVar6 = ((dVar4 + dVar4) * dVar2 - dVar3) + ai02_data[uVar1 + 0x14];
          uVar1 = uVar1 - 1;
          dVar5 = dVar2;
          dVar2 = dVar6;
        } while (1 < uVar1);
        dVar5 = ((dVar6 - dVar3) * 0.5 + 0.875) * x;
      }
      else {
        dVar2 = exp(x);
        dVar5 = xc_bessel_I1_scaled(x);
        dVar5 = dVar5 * dVar2;
      }
    }
    else {
      dVar5 = x * 0.5;
    }
  }
  return dVar5;
}

Assistant:

GPU_FUNCTION
double xc_bessel_I1(const double x)
{
  const double xmin    = 2.0 * DBL_MIN;
  const double x_small = 2.0 * M_SQRT2 * SQRT_DBL_EPSILON;
  const double y = fabs(x);
  double r = 0.0;

  if(y == 0.0)
    r = 0.0;
  else if(y < xmin) {
#ifndef HAVE_CUDA
    fprintf(stderr, "Underflow error in bessel_I1\n");
#endif
  } else if(y < x_small)
    r = 0.5*x;
  else if(y <= 3.0)
    r = x*(0.875 + xc_cheb_eval(y*y/4.5 - 1.0, bi1_data, 11));
  else
    r = exp(x)*xc_bessel_I1_scaled(x);

  return r;
}